

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O0

void anon_unknown.dwarf_108296::compressUncompress(unsigned_short *raw,int n)

{
  ushort *puVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  unsigned_short *puVar5;
  Array<unsigned_short> *this;
  int in_ESI;
  ushort *in_RDI;
  int i;
  int nCompressed;
  Array<unsigned_short> uncompressed;
  Array<char> compressed;
  long in_stack_ffffffffffffff38;
  Array<unsigned_short> *in_stack_ffffffffffffff40;
  int local_44;
  Array local_30 [16];
  Array local_20 [20];
  int local_c;
  ushort *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  Imf_3_2::Array<char>::Array((Array<char> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Imf_3_2::Array<unsigned_short>::Array(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  poVar3 = std::operator<<((ostream *)&std::cout,"compressing ");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  puVar1 = local_8;
  iVar2 = local_c;
  pcVar4 = Imf_3_2::Array::operator_cast_to_char_(local_20);
  iVar2 = Imf_3_2::hufCompress(puVar1,iVar2,pcVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"uncompressing ");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  pcVar4 = Imf_3_2::Array::operator_cast_to_char_(local_20);
  puVar5 = Imf_3_2::Array::operator_cast_to_unsigned_short_(local_30);
  Imf_3_2::hufUncompress(pcVar4,iVar2,puVar5,local_c);
  poVar3 = std::operator<<((ostream *)&std::cout,"comparing: ");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  local_44 = 0;
  while( true ) {
    if (local_c <= local_44) {
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(long)local_c * 2);
      poVar3 = std::operator<<(poVar3," bytes, compressed ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      this = (Array<unsigned_short> *)std::operator<<(poVar3," bytes");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      Imf_3_2::Array<unsigned_short>::~Array(this);
      Imf_3_2::Array<char>::~Array((Array<char> *)this);
      return;
    }
    puVar5 = Imf_3_2::Array::operator_cast_to_unsigned_short_(local_30);
    if (puVar5[local_44] != local_8[local_44]) break;
    local_44 = local_44 + 1;
  }
  __assert_fail("uncompressed[i] == raw[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testHuf.cpp"
                ,99,"void (anonymous namespace)::compressUncompress(const unsigned short *, int)");
}

Assistant:

void
compressUncompress (const unsigned short raw[], int n)
{
    Array<char>           compressed (3 * n + 4 * 65536);
    Array<unsigned short> uncompressed (n);

    cout << "compressing " << flush;

    int nCompressed = hufCompress (raw, n, compressed);

    cout << "uncompressing " << flush;

    hufUncompress (compressed, nCompressed, uncompressed, n);

    cout << "comparing: " << flush;

    for (int i = 0; i < n; ++i)
        assert (uncompressed[i] == raw[i]);

    cout << sizeof (raw[0]) * n << " bytes, compressed " << nCompressed
         << " bytes" << endl;
}